

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_container.h
# Opt level: O0

mapped_type * __thiscall
gtl::internal_btree::
btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
::operator[](btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
             *this,key_type *key)

{
  pointer ppVar1;
  tuple<> local_39;
  tuple<const_int_&> local_38;
  pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
  local_30;
  key_type *local_18;
  key_type *key_local;
  btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  *this_local;
  
  local_18 = key;
  key_local = (key_type *)this;
  std::forward_as_tuple<int_const&>((int *)&local_38);
  std::forward_as_tuple<>();
  btree<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
  ::insert_unique<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<>>
            (&local_30,
             (btree<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
              *)this,key,(piecewise_construct_t *)&std::piecewise_construct,&local_38,&local_39);
  ppVar1 = btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
           ::operator->(&local_30.first);
  return &ppVar1->second;
}

Assistant:

mapped_type &operator[](const key_type &key) {
    return this->tree_
        .insert_unique(key, std::piecewise_construct,
                       std::forward_as_tuple(key), std::forward_as_tuple())
        .first->second;
  }